

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Bad.c
# Opt level: O0

DdNode * Llb_BddComputeBad(Aig_Man_t *pInit,DdManager *dd,abctime TimeOut)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t **ppNodes;
  Vec_Ptr_t *pVVar7;
  Aig_Obj_t *pAVar8;
  int local_60;
  int local_5c;
  int k;
  int i;
  Aig_Obj_t *pObj;
  DdNode *bResult;
  DdNode *bTemp;
  DdNode *bBdd1;
  DdNode *bBdd0;
  Vec_Ptr_t *vNodes;
  abctime TimeOut_local;
  DdManager *dd_local;
  Aig_Man_t *pInit_local;
  
  iVar2 = Cudd_ReadSize(dd);
  iVar3 = Aig_ManCiNum(pInit);
  if (iVar2 != iVar3) {
    __assert_fail("Cudd_ReadSize(dd) == Aig_ManCiNum(pInit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Bad.c"
                  ,0x33,"DdNode *Llb_BddComputeBad(Aig_Man_t *, DdManager *, abctime)");
  }
  pDVar4 = Cudd_ReadOne(dd);
  pAVar5 = Aig_ManConst1(pInit);
  (pAVar5->field_5).pData = pDVar4;
  for (local_5c = 0; iVar2 = Saig_ManRegNum(pInit), local_5c < iVar2; local_5c = local_5c + 1) {
    pVVar7 = pInit->vCis;
    iVar2 = Saig_ManPiNum(pInit);
    pvVar6 = Vec_PtrEntry(pVVar7,local_5c + iVar2);
    pDVar4 = Cudd_bddIthVar(dd,local_5c);
    *(DdNode **)((long)pvVar6 + 0x28) = pDVar4;
  }
  for (local_5c = 0; iVar2 = Saig_ManPiNum(pInit), local_5c < iVar2; local_5c = local_5c + 1) {
    pvVar6 = Vec_PtrEntry(pInit->vCis,local_5c);
    iVar2 = Aig_ManRegNum(pInit);
    pDVar4 = Cudd_bddIthVar(dd,iVar2 + local_5c);
    *(DdNode **)((long)pvVar6 + 0x28) = pDVar4;
  }
  ppNodes = (Aig_Obj_t **)Vec_PtrArray(pInit->vCos);
  iVar2 = Saig_ManPoNum(pInit);
  pVVar7 = Aig_ManDfsNodes(pInit,ppNodes,iVar2);
  local_5c = 0;
  do {
    iVar2 = Vec_PtrSize(pVVar7);
    if (iVar2 <= local_5c) {
      pObj = (Aig_Obj_t *)Cudd_ReadLogicZero(dd);
      Cudd_Ref((DdNode *)pObj);
      for (local_5c = 0; iVar2 = Saig_ManPoNum(pInit), local_5c < iVar2; local_5c = local_5c + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pInit->vCos,local_5c);
        pAVar8 = Aig_ObjFanin0(pAVar5);
        pvVar6 = (pAVar8->field_5).pData;
        iVar2 = Aig_ObjFaninC0(pAVar5);
        pAVar5 = (Aig_Obj_t *)Cudd_bddOr(dd,(DdNode *)pObj,(DdNode *)((ulong)pvVar6 ^ (long)iVar2));
        Cudd_Ref((DdNode *)pAVar5);
        Cudd_RecursiveDeref(dd,(DdNode *)pObj);
        pObj = pAVar5;
      }
      for (local_5c = 0; iVar2 = Vec_PtrSize(pVVar7), local_5c < iVar2; local_5c = local_5c + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar7,local_5c);
        iVar2 = Aig_ObjIsNode(pAVar5);
        if (iVar2 != 0) {
          Cudd_RecursiveDeref(dd,(DdNode *)(pAVar5->field_5).pData);
        }
      }
      Vec_PtrFree(pVVar7);
      Cudd_Deref((DdNode *)pObj);
      return (DdNode *)pObj;
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar7,local_5c);
    iVar2 = Aig_ObjIsNode(pAVar5);
    if (iVar2 != 0) {
      pAVar8 = Aig_ObjFanin0(pAVar5);
      pvVar6 = (pAVar8->field_5).pData;
      iVar2 = Aig_ObjFaninC0(pAVar5);
      pAVar8 = Aig_ObjFanin1(pAVar5);
      pvVar1 = (pAVar8->field_5).pData;
      iVar3 = Aig_ObjFaninC1(pAVar5);
      pDVar4 = Cudd_bddAnd(dd,(DdNode *)((ulong)pvVar6 ^ (long)iVar2),
                           (DdNode *)((ulong)pvVar1 ^ (long)iVar3));
      (pAVar5->field_5).pData = pDVar4;
      if ((pAVar5->field_5).pData == (void *)0x0) {
        for (local_60 = 0; local_60 < local_5c; local_60 = local_60 + 1) {
          pvVar6 = Vec_PtrEntry(pVVar7,local_60);
          if (*(long *)((long)pvVar6 + 0x28) != 0) {
            Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar6 + 0x28));
          }
        }
        Vec_PtrFree(pVVar7);
        return (DdNode *)0x0;
      }
      Cudd_Ref((DdNode *)(pAVar5->field_5).pData);
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Computes bad in working manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
DdNode * Llb_BddComputeBad( Aig_Man_t * pInit, DdManager * dd, abctime TimeOut )
{
    Vec_Ptr_t * vNodes;
    DdNode * bBdd0, * bBdd1, * bTemp, * bResult;
    Aig_Obj_t * pObj;
    int i, k;
    assert( Cudd_ReadSize(dd) == Aig_ManCiNum(pInit) );
    // initialize elementary variables
    Aig_ManConst1(pInit)->pData = Cudd_ReadOne( dd );
    Saig_ManForEachLo( pInit, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, i );
    Saig_ManForEachPi( pInit, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Aig_ManRegNum(pInit) + i );
    // compute internal nodes
    vNodes = Aig_ManDfsNodes( pInit, (Aig_Obj_t **)Vec_PtrArray(pInit->vCos), Saig_ManPoNum(pInit) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Extra_bddAndTime( dd, bBdd0, bBdd1, TimeOut );
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( pObj->pData == NULL )
        {
            Vec_PtrForEachEntryStop( Aig_Obj_t *, vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }
    // quantify PIs of each PO
    bResult = Cudd_ReadLogicZero( dd );  Cudd_Ref( bResult );
    Saig_ManForEachPo( pInit, pObj, i )
    {
        bBdd0   = Cudd_NotCond( Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bResult = Cudd_bddOr( dd, bTemp = bResult, bBdd0 );     Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    // deref
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    }
    Vec_PtrFree( vNodes );
    Cudd_Deref( bResult );
    return bResult;
}